

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O2

aiNode * __thiscall
Assimp::Ogre::Bone::ConvertToAssimpNode(Bone *this,Skeleton *skeleton,aiNode *parentNode)

{
  pointer puVar1;
  pointer puVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  aiNode *this_00;
  long lVar18;
  aiNode **ppaVar19;
  Bone *this_01;
  aiNode *paVar20;
  DeadlyImportError *this_02;
  ostream *poVar21;
  long lVar22;
  long lVar23;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00,&this->name);
  this_00->mParent = parentNode;
  fVar14 = (this->defaultPose).a1;
  fVar15 = (this->defaultPose).a2;
  fVar16 = (this->defaultPose).a3;
  fVar17 = (this->defaultPose).a4;
  fVar10 = (this->defaultPose).b1;
  fVar11 = (this->defaultPose).b2;
  fVar12 = (this->defaultPose).b3;
  fVar13 = (this->defaultPose).b4;
  fVar6 = (this->defaultPose).c1;
  fVar7 = (this->defaultPose).c2;
  fVar8 = (this->defaultPose).c3;
  fVar9 = (this->defaultPose).c4;
  fVar3 = (this->defaultPose).d2;
  fVar4 = (this->defaultPose).d3;
  fVar5 = (this->defaultPose).d4;
  (this_00->mTransformation).d1 = (this->defaultPose).d1;
  (this_00->mTransformation).d2 = fVar3;
  (this_00->mTransformation).d3 = fVar4;
  (this_00->mTransformation).d4 = fVar5;
  (this_00->mTransformation).c1 = fVar6;
  (this_00->mTransformation).c2 = fVar7;
  (this_00->mTransformation).c3 = fVar8;
  (this_00->mTransformation).c4 = fVar9;
  (this_00->mTransformation).b1 = fVar10;
  (this_00->mTransformation).b2 = fVar11;
  (this_00->mTransformation).b3 = fVar12;
  (this_00->mTransformation).b4 = fVar13;
  (this_00->mTransformation).a1 = fVar14;
  (this_00->mTransformation).a2 = fVar15;
  (this_00->mTransformation).a3 = fVar16;
  (this_00->mTransformation).a4 = fVar17;
  puVar1 = (this->children).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->children).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar1 != puVar2) {
    lVar18 = (long)puVar2 - (long)puVar1;
    lVar22 = lVar18 >> 1;
    this_00->mNumChildren = (uint)lVar22;
    ppaVar19 = (aiNode **)operator_new__(lVar18 * 4 & 0x7fffffff8);
    this_00->mChildren = ppaVar19;
    lVar23 = 0;
    for (lVar18 = 0; lVar22 != lVar18; lVar18 = lVar18 + 1) {
      this_01 = Skeleton::BoneById(skeleton,(this->children).
                                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                            ._M_impl.super__Vector_impl_data._M_start[lVar18]);
      if (this_01 == (Bone *)0x0) {
        this_02 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::operator<<((ostream *)local_1a8,"ConvertToAssimpNode: Failed to find child bone ");
        poVar21 = (ostream *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                             local_1a8,
                             (unsigned_short *)
                             ((long)(this->children).
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_start - lVar23));
        std::operator<<(poVar21," for parent ");
        poVar21 = (ostream *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                             poVar21,&this->id);
        std::operator<<(poVar21," ");
        std::operator<<(poVar21,(string *)&this->name);
        std::__cxx11::stringbuf::str();
        DeadlyImportError::DeadlyImportError(this_02,&local_1c8);
        __cxa_throw(this_02,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      paVar20 = ConvertToAssimpNode(this_01,skeleton,this_00);
      this_00->mChildren[lVar18] = paVar20;
      lVar23 = lVar23 + -2;
    }
  }
  return this_00;
}

Assistant:

aiNode *Bone::ConvertToAssimpNode(Skeleton *skeleton, aiNode *parentNode)
{
    // Bone node
    aiNode* node = new aiNode(name);
    node->mParent = parentNode;
    node->mTransformation = defaultPose;

    // Children
    if (!children.empty())
    {
        node->mNumChildren = static_cast<unsigned int>(children.size());
        node->mChildren = new aiNode*[node->mNumChildren];

        for(size_t i=0, len=children.size(); i<len; ++i)
        {
            Bone *child = skeleton->BoneById(children[i]);
            if (!child) {
                throw DeadlyImportError(Formatter::format() << "ConvertToAssimpNode: Failed to find child bone " << children[i] << " for parent " << id << " " << name);
            }
            node->mChildren[i] = child->ConvertToAssimpNode(skeleton, node);
        }
    }
    return node;
}